

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O3

void G1_mul(G1 *rop,G1 *op,BIGNUM *scalar,ATE_CTX *ctx)

{
  fp_struct_st *src;
  fp_struct_st *dst;
  int iVar1;
  uint uVar2;
  uint uVar3;
  BN_CTX *ctx_00;
  BIGNUM *r;
  unsigned_long *puVar4;
  long lVar5;
  G1 *pGVar6;
  G1 *pGVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uchar p_str [33];
  uchar table_storage [2080];
  int local_888 [7];
  byte local_869;
  undefined1 local_840 [1536];
  G1 local_240;
  G1 local_1e0;
  G1 local_180;
  G1 local_120;
  G1 GStack_c0;
  
  bVar10 = 0;
  ctx_00 = BN_CTX_new();
  iVar1 = BN_num_bits((BIGNUM *)scalar);
  if (iVar1 < 0x101) {
    iVar1 = BN_is_negative(scalar);
    r = scalar;
    if (iVar1 != 0) goto LAB_0011d47d;
  }
  else {
LAB_0011d47d:
    r = (BIGNUM *)BN_CTX_get(ctx_00);
    if (r == (BIGNUM *)0x0) goto LAB_0011d92b;
    iVar1 = BN_nnmod((BIGNUM *)r,(BIGNUM *)scalar,(BIGNUM *)ctx->order,ctx_00);
    if (iVar1 == 0) goto LAB_0011d92b;
  }
  iVar1 = bn_get_top(r);
  uVar9 = 0;
  if (iVar1 < 1) {
LAB_0011d544:
    memset((void *)((long)local_888 + (uVar9 & 0xffffffff)),0,(ulong)(0x21 - (int)uVar9));
  }
  else {
    do {
      uVar8 = uVar9;
      puVar4 = bn_get_words(r);
      *(undefined8 *)((long)local_888 + uVar8) = *(undefined8 *)((long)puVar4 + uVar8);
      uVar9 = uVar8 + 8;
      iVar1 = bn_get_top(r);
    } while ((long)uVar9 < (long)(iVar1 << 3));
    if (uVar8 < 0x19) goto LAB_0011d544;
  }
  G1_copy(&local_240,op);
  G1_scatter_w5(local_840,&local_240,1);
  G1_double(&local_1e0,&local_240,ctx);
  G1_scatter_w5(local_840,&local_1e0,2);
  G1_add(&local_180,&local_1e0,&local_240,ctx);
  G1_scatter_w5(local_840,&local_180,3);
  G1_double(&local_1e0,&local_1e0,ctx);
  G1_scatter_w5(local_840,&local_1e0,4);
  G1_double(&local_180,&local_180,ctx);
  G1_scatter_w5(local_840,&local_180,6);
  G1_add(&local_120,&local_1e0,&local_240,ctx);
  G1_scatter_w5(local_840,&local_120,5);
  G1_add(&GStack_c0,&local_180,&local_240,ctx);
  G1_scatter_w5(local_840,&GStack_c0,7);
  G1_double(&local_1e0,&local_1e0,ctx);
  G1_scatter_w5(local_840,&local_1e0,8);
  G1_double(&local_180,&local_180,ctx);
  G1_scatter_w5(local_840,&local_180,0xc);
  G1_double(&local_120,&local_120,ctx);
  G1_scatter_w5(local_840,&local_120,10);
  G1_double(&GStack_c0,&GStack_c0,ctx);
  G1_scatter_w5(local_840,&GStack_c0,0xe);
  G1_add(&local_180,&local_180,&local_240,ctx);
  G1_scatter_w5(local_840,&local_180,0xd);
  G1_add(&local_120,&local_120,&local_240,ctx);
  G1_scatter_w5(local_840,&local_120,0xb);
  G1_add(&GStack_c0,&GStack_c0,&local_240,ctx);
  G1_scatter_w5(local_840,&GStack_c0,0xf);
  G1_add(&local_180,&local_1e0,&local_240,ctx);
  G1_scatter_w5(local_840,&local_180,9);
  G1_double(&local_1e0,&local_1e0,ctx);
  G1_scatter_w5(local_840,&local_1e0,0x10);
  uVar2 = _booth_recode_w5((uint)(local_869 >> 6));
  G1_gather_w5(&local_240,local_840,uVar2 >> 1);
  pGVar6 = &local_240;
  pGVar7 = rop;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    pGVar7->m_x[0].d[0] = pGVar6->m_x[0].d[0];
    pGVar6 = (G1 *)((long)pGVar6 + (ulong)bVar10 * -0x10 + 8);
    pGVar7 = (G1 *)((long)pGVar7 + (ulong)bVar10 * -0x10 + 8);
  }
  src = local_1e0.m_y;
  dst = local_240.m_y;
  uVar2 = 0xff;
  do {
    if (uVar2 != 0xff) {
      uVar3 = _booth_recode_w5(*(ushort *)((long)local_888 + (ulong)(uVar2 - 1 >> 3)) >>
                               ((byte)(uVar2 - 1) & 7) & 0x3f);
      G1_gather_w5(&local_240,local_840,uVar3 >> 1);
      fp_neg(src,dst,ctx->p);
      copy_conditional(dst->d,src->d,(ulong)(uVar3 & 1));
      G1_add(rop,rop,&local_240,ctx);
    }
    uVar2 = uVar2 - 5;
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
  } while (4 < uVar2);
  uVar2 = _booth_recode_w5(local_888[0] * 2 & 0x3e);
  G1_gather_w5(&local_240,local_840,uVar2 >> 1);
  fp_neg(src,dst,ctx->p);
  copy_conditional(dst->d,src->d,(ulong)(uVar2 & 1));
  G1_add(rop,rop,&local_240,ctx);
LAB_0011d92b:
  BN_CTX_free(ctx_00);
  return;
}

Assistant:

void G1_mul(G1 *rop, const G1 *op, const BIGNUM *scalar, const ATE_CTX *ctx)
{
    // int i;
    // G1 r;
    // G1_set(&r, op);

    // for(i = BN_num_bits(scalar) - 1; i > 0; i--)
    // {
    //     G1_double(&r, &r, ctx);
    //     if(BN_is_bit_set(scalar, i - 1)) 
    //     {
    //         G1_add(&r, &r, op, ctx);
    //     }
    // }
    // G1_set(rop, &r);
    G1_windowed_mul(rop, scalar, op, ctx);
}